

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

status_t tchecker::refdbm::constrain
                   (db_t *rdbm,reference_clock_variables_t *r,clock_constraint_container_t *cc)

{
  bool bVar1;
  status_t sVar2;
  reference c_00;
  status_t status;
  clock_constraint_t *c;
  const_iterator __end2;
  const_iterator __begin2;
  clock_constraint_container_t *__range2;
  clock_constraint_container_t *cc_local;
  reference_clock_variables_t *r_local;
  db_t *rdbm_local;
  
  __end2 = std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
           ::begin(cc);
  c = (clock_constraint_t *)
      std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::end
                (cc);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
                                *)&c);
    if (!bVar1) {
      return NON_EMPTY;
    }
    c_00 = __gnu_cxx::
           __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
           ::operator*(&__end2);
    sVar2 = constrain(rdbm,r,c_00);
    if (sVar2 == EMPTY) break;
    __gnu_cxx::
    __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
    ::operator++(&__end2);
  }
  return EMPTY;
}

Assistant:

enum tchecker::dbm::status_t constrain(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                       tchecker::clock_constraint_container_t const & cc)
{
  for (tchecker::clock_constraint_t const & c : cc) {
    enum tchecker::dbm::status_t status = tchecker::refdbm::constrain(rdbm, r, c);
    if (status == tchecker::dbm::EMPTY)
      return status;
  }
  return tchecker::dbm::NON_EMPTY;
}